

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O0

Dim * __thiscall
cnn::LogSumExp::dim_forward(LogSumExp *this,vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  bool bVar1;
  const_reference pvVar2;
  ulong uVar3;
  size_type sVar4;
  ostream *os;
  invalid_argument *this_00;
  uint *puVar5;
  vector<cnn::Dim,_std::allocator<cnn::Dim>_> *in_RDX;
  __off_t __length;
  __off_t __length_00;
  Dim *in_RDI;
  Dim *d;
  ostringstream s;
  uint i;
  Dim *in_stack_fffffffffffffd98;
  Dim *in_stack_fffffffffffffda0;
  ostringstream *this_01;
  string local_228 [48];
  ostringstream local_1f8 [376];
  Dim local_80 [3];
  uint local_14;
  vector<cnn::Dim,_std::allocator<cnn::Dim>_> *local_10;
  
  local_10 = in_RDX;
  pvVar2 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](in_RDX,0);
  Dim::truncate(in_RDI,(char *)pvVar2,__length);
  local_14 = 1;
  while( true ) {
    uVar3 = (ulong)local_14;
    sVar4 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::size(local_10);
    if (sVar4 <= uVar3) {
      return in_RDI;
    }
    Dim::single_batch(in_stack_fffffffffffffda0);
    pvVar2 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](local_10,(ulong)local_14);
    Dim::truncate(local_80,(char *)pvVar2,__length_00);
    Dim::single_batch(in_stack_fffffffffffffda0);
    bVar1 = cnn::operator!=(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    if (bVar1) break;
    pvVar2 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](local_10,(ulong)local_14);
    puVar5 = std::max<unsigned_int>(&pvVar2->bd,&in_RDI->bd);
    in_RDI->bd = *puVar5;
    local_14 = local_14 + 1;
  }
  this_01 = local_1f8;
  std::__cxx11::ostringstream::ostringstream(this_01);
  os = std::operator<<((ostream *)this_01,"Mismatched input dimensions in LogSumExp: ");
  cnn::operator<<(os,(vector<cnn::Dim,_std::allocator<cnn::Dim>_> *)this_01);
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::invalid_argument::invalid_argument(this_00,local_228);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Dim LogSumExp::dim_forward(const vector<Dim>& xs) const {
  Dim d = xs[0].truncate();
  for (unsigned i = 1; i < xs.size(); ++i) {
    if (d.single_batch() != xs[i].truncate().single_batch()) {
      ostringstream s; s << "Mismatched input dimensions in LogSumExp: " << xs;
      throw std::invalid_argument(s.str());
    }
    d.bd = max(xs[i].bd, d.bd);
  }
  return d;
}